

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O1

void k053260_write_rom(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  k053260_state *info;
  
  uVar1 = *(uint *)((long)chip + 0xb8);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)chip + 0xb0)),data,__n);
  return;
}

Assistant:

static void k053260_write_rom(void *chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	k053260_state *info = (k053260_state *)chip;
	
	if (offset > info->rom_size)
		return;
	if (offset + length > info->rom_size)
		length = info->rom_size - offset;
	
	memcpy(info->rom + offset, data, length);
	
	return;
}